

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O1

void __thiscall cmCTestRunTest::ComputeArguments(cmCTestRunTest *this)

{
  bool bVar1;
  cmCTestTestHandler *this_00;
  _Base_ptr __s;
  cmCTest *pcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  void *this_01;
  ostream *poVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  pointer pbVar5;
  char *pcVar6;
  pointer pbVar7;
  string testCommand;
  ostringstream cmCTestLog_msg;
  long *local_1f0;
  long local_1e0 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1d0;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1d0 = &this->Arguments;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_1d0,
                    (this->Arguments).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  this_00 = this->TestHandler;
  pbVar7 = (this->TestProperties->Args).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = pbVar7 + 1;
  if (this_00->MemCheck == true) {
    __s = this_00[1].super_cmCTestGenericHandler.Options._M_t._M_impl.super__Rb_tree_header.
          _M_header._M_left;
    pcVar6 = (char *)(this->ActualCommand)._M_string_length;
    strlen((char *)__s);
    std::__cxx11::string::_M_replace((ulong)&this->ActualCommand,0,pcVar6,(ulong)__s);
    cmCTestTestHandler::FindTheExecutable_abi_cxx11_
              (local_1a8,this->TestHandler,
               (this->TestProperties->Args).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    std::__cxx11::string::operator=
              ((string *)
               ((this->TestProperties->Args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 1),(string *)local_1a8);
    pcVar6 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
      pcVar6 = extraout_RDX_00;
    }
  }
  else {
    cmCTestTestHandler::FindTheExecutable_abi_cxx11_(local_1a8,this_00,(pbVar5->_M_dataplus)._M_p);
    std::__cxx11::string::operator=((string *)&this->ActualCommand,(string *)local_1a8);
    pcVar6 = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
      pcVar6 = extraout_RDX_02;
    }
    pbVar5 = pbVar7 + 2;
  }
  pvVar3 = local_1d0;
  cmSystemTools::ConvertToOutputPath_abi_cxx11_
            (&local_1c8,(cmSystemTools *)(this->ActualCommand)._M_dataplus._M_p,pcVar6);
  (*(this->TestHandler->super_cmCTestGenericHandler).super_cmObject._vptr_cmObject[10])
            (this->TestHandler,pvVar3,(ulong)(uint)this->Index);
  pbVar7 = (this->Arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar7 != (this->Arguments).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__cxx11::string::append((char *)&local_1c8);
      std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)(pbVar7->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_1c8);
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != (this->Arguments).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pvVar3 = local_1d0;
  if (pbVar5 != (this->TestProperties->Args).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__cxx11::string::append((char *)&local_1c8);
      std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)(pbVar5->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_1c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(pvVar3,pbVar5);
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != (this->TestProperties->Args).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).FullCommandLine);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ios::widen((char)local_1a8 + (char)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18));
  std::ostream::put((char)local_1a8);
  this_01 = (void *)std::ostream::flush();
  poVar4 = (ostream *)std::ostream::operator<<(this_01,this->Index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
  bVar1 = this->TestHandler->MemCheck;
  pcVar6 = "Test";
  if (bVar1 != false) {
    pcVar6 = "MemCheck";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,(ulong)bVar1 * 4 + 4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," command: ",10);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
               ,0x248,(char *)local_1f0,false);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((this->TestProperties->Environment).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->TestProperties->Environment).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar4 = (ostream *)std::ostream::operator<<(local_1a8,this->Index);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Environment variables: ",0x17);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x24e,(char *)local_1f0,false);
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0,local_1e0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  pbVar5 = (this->TestProperties->Environment).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar5 != (this->TestProperties->Environment).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar4 = (ostream *)std::ostream::operator<<(local_1a8,this->Index);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":  ",3);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      pcVar2 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x255,(char *)local_1f0,false);
      if (local_1f0 != local_1e0) {
        operator_delete(local_1f0,local_1e0[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != (this->TestProperties->Environment).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestRunTest::ComputeArguments()
{
  this->Arguments.clear(); // reset becaue this might be a rerun
  std::vector<std::string>::const_iterator j =
    this->TestProperties->Args.begin();
  ++j; // skip test name
  // find the test executable
  if(this->TestHandler->MemCheck)
    {
    cmCTestMemCheckHandler * handler = static_cast<cmCTestMemCheckHandler*>
      (this->TestHandler);
    this->ActualCommand = handler->MemoryTester.c_str();
    this->TestProperties->Args[1] = this->TestHandler->FindTheExecutable(
      this->TestProperties->Args[1].c_str());
    }
  else
    {
    this->ActualCommand =
      this->TestHandler->FindTheExecutable(
      this->TestProperties->Args[1].c_str());
    ++j; //skip the executable (it will be actualCommand)
    }
  std::string testCommand
    = cmSystemTools::ConvertToOutputPath(this->ActualCommand.c_str());

  //Prepends memcheck args to our command string
  this->TestHandler->GenerateTestCommand(this->Arguments, this->Index);
  for(std::vector<std::string>::iterator i = this->Arguments.begin();
      i != this->Arguments.end(); ++i)
    {
    testCommand += " \"";
    testCommand += *i;
    testCommand += "\"";
    }

  for(;j != this->TestProperties->Args.end(); ++j)
    {
    testCommand += " \"";
    testCommand += *j;
    testCommand += "\"";
    this->Arguments.push_back(*j);
    }
  this->TestResult.FullCommandLine = testCommand;

  // Print the test command in verbose mode
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl
             << this->Index << ": "
             << (this->TestHandler->MemCheck?"MemCheck":"Test")
             << " command: " << testCommand
             << std::endl);

  // Print any test-specific env vars in verbose mode
  if (this->TestProperties->Environment.size())
    {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, this->Index << ": "
               << "Environment variables: " << std::endl);
    }
  for(std::vector<std::string>::const_iterator e =
      this->TestProperties->Environment.begin();
      e != this->TestProperties->Environment.end(); ++e)
    {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, this->Index << ":  " << *e
               << std::endl);
    }
}